

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

ssize_t __thiscall PosixRunWriter::write(PosixRunWriter *this,int __fd,void *__buf,size_t __n)

{
  byte bVar1;
  size_type sVar2;
  size_type extraout_RAX;
  int64_t diff;
  undefined6 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe6;
  byte in_stack_ffffffffffffffe7;
  long local_18;
  
  for (local_18 = ((ulong)(uint)__fd - this->prev_) + -1; bVar1 = (byte)local_18, 0x7f < local_18;
      local_18 = local_18 >> 7) {
    this->out_bytes_ = this->out_bytes_ + 1;
    in_stack_ffffffffffffffe7 = bVar1 & 0x7f | 0x80;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               (CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)) &
                0x7fffffffffffffff | 0x8000000000000000),(value_type_conflict1 *)this);
  }
  this->out_bytes_ = this->out_bytes_ + 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffffe7,CONCAT16(bVar1,in_stack_ffffffffffffffe0)),
             (value_type_conflict1 *)this);
  this->prev_ = (ulong)(uint)__fd;
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buffer_);
  if (0x8000000 < sVar2) {
    flush((PosixRunWriter *)diff);
    sVar2 = extraout_RAX;
  }
  return sVar2;
}

Assistant:

void PosixRunWriter::write(FileId next) {
    assert(next > prev_);
    int64_t diff = (next - prev_) - 1;
    while (diff >= 0x80U) {
        out_bytes_++;
        buffer_.push_back(static_cast<uint8_t>(0x80U | (diff & 0x7FU)));
        diff >>= 7;
    }
    out_bytes_++;
    buffer_.push_back(static_cast<uint8_t>(diff));
    prev_ = next;

    if (buffer_.size() > RUN_BUFFER_SIZE) {
        flush();
    }
}